

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O2

void Omega_h::fix(Mesh *mesh,AdaptOpts *adapt_opts,Omega_h_Isotropy isotropy,bool verbose)

{
  bool bVar1;
  Int IVar2;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    bVar1 = can_print(mesh);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"Computing bad-mesh \"implied\" metric\n");
      bVar1 = true;
      goto LAB_00294122;
    }
  }
  bVar1 = false;
LAB_00294122:
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 3) {
    compute_ill_metric_dim<3>(mesh,adapt_opts,isotropy);
  }
  else {
    IVar2 = Mesh::dim(mesh);
    if (IVar2 == 2) {
      compute_ill_metric_dim<2>(mesh,adapt_opts,isotropy);
    }
    else {
      IVar2 = Mesh::dim(mesh);
      if (IVar2 != 1) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
             ,0x4f);
      }
      compute_ill_metric_dim<1>(mesh,adapt_opts,isotropy);
    }
  }
  fix_for_given_metric(mesh,adapt_opts,bVar1);
  return;
}

Assistant:

void fix(Mesh* mesh, AdaptOpts const& adapt_opts, Omega_h_Isotropy isotropy,
    bool verbose) {
  verbose = verbose && can_print(mesh);
  if (verbose) std::cout << "Computing bad-mesh \"implied\" metric\n";
  compute_ill_metric(mesh, adapt_opts, isotropy);
  fix_for_given_metric(mesh, adapt_opts, verbose);
  // TODO: commenting this out because metric quality corrections assume
  // isotropy!!! we need to fix this, but for now just skip this step
  if ((0)) {
    if (verbose) std::cout << "Computing more typical \"implied\" metric\n";
    compute_typical_metric(mesh, isotropy);
    fix_for_given_metric(mesh, adapt_opts, verbose);
  }
}